

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O1

float __thiscall
ggx::evaluate(ggx *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar5 = 0.0;
  if ((view_dir->field_0).field_0.z <= 0.0) {
    *probability_density_function = 0.0;
  }
  else {
    fVar5 = calculate_shadow_masking_term(this,light_dir,view_dir);
    fVar7 = (view_dir->field_0).field_0.x + (light_dir->field_0).field_0.x;
    fVar6 = (view_dir->field_0).field_0.y + (light_dir->field_0).field_0.y;
    fVar8 = (view_dir->field_0).field_0.z + (light_dir->field_0).field_0.z;
    fVar1 = fVar8 * fVar8 + fVar6 * fVar6 + fVar7 * fVar7;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = 1.0 / fVar1;
    fVar8 = fVar8 * fVar1;
    fVar2 = (fVar7 * fVar1) / fVar8;
    fVar4 = (fVar6 * fVar1) / fVar8;
    fVar3 = this->_alpha;
    fVar2 = 1.0 / (((fVar2 * fVar2 + fVar4 * fVar4) / fVar3) / fVar3 + 1.0);
    fVar3 = (fVar2 * fVar2) / (fVar3 * 3.14159 * fVar3 * fVar8 * fVar8 * fVar8 * fVar8);
    *probability_density_function =
         ABS((fVar8 * fVar3 * 0.25) /
             (fVar8 * (view_dir->field_0).field_0.z +
             fVar6 * fVar1 * (view_dir->field_0).field_0.y +
             fVar7 * fVar1 * (view_dir->field_0).field_0.x));
    fVar5 = (fVar5 * fVar3 * 0.25) / (view_dir->field_0).field_0.z;
  }
  return fVar5;
}

Assistant:

float ggx::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  if (view_dir.z <= 0)
  {
    probability_density_function = 0;
    return 0;
  }

  float g2 = calculate_shadow_masking_term(light_dir, view_dir);

  const glm::vec3 h = glm::normalize(view_dir + light_dir);
  float ndf = calculateNDF(h);

  // Additional factor in the pdf (1/(4 dot(v,h))) is explained here:
  // - Microfacet Models for Refraction through Rough Surfaces
  // - Notes on the Ward BRDF, Bruce Walter
  probability_density_function = fabsf(ndf * h.z / 4.0f / glm::dot(view_dir, h));

  // We assume that Fresnel factor is equal to 1.
  float res = ndf * g2 / 4.0f / view_dir.z;

  return res;
}